

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFObjectParser.cpp
# Opt level: O0

string * __thiscall
PDFObjectParser::MaybeDecryptString
          (string *__return_storage_ptr__,PDFObjectParser *this,string *inString)

{
  IPDFParserExtender *pIVar1;
  bool bVar2;
  string local_40 [32];
  string *local_20;
  string *inString_local;
  PDFObjectParser *this_local;
  
  local_20 = inString;
  inString_local = (string *)this;
  this_local = (PDFObjectParser *)__return_storage_ptr__;
  if ((this->mDecryptionHelper == (DecryptionHelper *)0x0) ||
     (bVar2 = DecryptionHelper::IsEncrypted(this->mDecryptionHelper), !bVar2)) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_20);
  }
  else {
    bVar2 = DecryptionHelper::CanDecryptDocument(this->mDecryptionHelper);
    if (bVar2) {
      DecryptionHelper::DecryptString(__return_storage_ptr__,this->mDecryptionHelper,local_20);
    }
    else if (this->mParserExtender == (IPDFParserExtender *)0x0) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_20);
    }
    else {
      pIVar1 = this->mParserExtender;
      std::__cxx11::string::string(local_40,(string *)local_20);
      (**(code **)(*(long *)pIVar1 + 0x28))(__return_storage_ptr__,pIVar1,local_40);
      std::__cxx11::string::~string(local_40);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PDFObjectParser::MaybeDecryptString(const std::string& inString) {
	if (mDecryptionHelper && mDecryptionHelper->IsEncrypted()) {

		if (mDecryptionHelper->CanDecryptDocument())
			return mDecryptionHelper->DecryptString(inString);
		else {
			if (mParserExtender)
				return mParserExtender->DecryptString(inString);
			else
				return inString;
		}
	}
	else {
		return inString;
	}
}